

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resample_filters.cpp
# Opt level: O2

float crnlib::gaussian_filter(float t)

{
  float fVar1;
  double dVar2;
  float fVar3;
  
  fVar3 = -t;
  if (-t <= t) {
    fVar3 = t;
  }
  fVar1 = 0.0;
  if (fVar3 < 1.25) {
    fVar1 = expf(fVar3 * -2.0 * fVar3);
    dVar2 = blackman_exact_window((double)(fVar3 / 1.25));
    dVar2 = dVar2 * (double)fVar1 * 0.7978845608028654;
    fVar1 = 0.0;
    if (1.249999968422344e-05 <= ABS(dVar2)) {
      fVar1 = (float)dVar2;
    }
  }
  return fVar1;
}

Assistant:

static float gaussian_filter(float t)  // with blackman window
{
  if (t < 0)
    t = -t;
  if (t < GAUSSIAN_SUPPORT)
    return clean(exp(-2.0f * t * t) * sqrt(2.0f / M_PI) * blackman_exact_window(t / GAUSSIAN_SUPPORT));
  else
    return 0.0f;
}